

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.cpp
# Opt level: O1

void __thiscall Scanner::add_tok(Scanner *this,token tok_type)

{
  size_type *psVar1;
  undefined1 local_48 [8];
  tok temp;
  
  psVar1 = &temp.s._M_string_length;
  temp.s._M_dataplus._M_p = (pointer)0x0;
  temp.s._M_string_length._0_1_ = 0;
  temp._0_8_ = psVar1;
  std::__cxx11::string::_M_assign((string *)&temp);
  local_48._0_4_ = this->lines;
  local_48._4_4_ = tok_type;
  std::vector<tok,_std::allocator<tok>_>::push_back(&this->toks,(value_type *)local_48);
  if ((size_type *)temp._0_8_ != psVar1) {
    operator_delete((void *)temp._0_8_);
  }
  return;
}

Assistant:

void Scanner::add_tok(token tok_type)
{
  tok temp;
  temp.s = tstr;
  temp.t = tok_type;
  temp.line = lines;
  (toks).push_back(temp);
}